

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O3

void __thiscall adios2::transport::FileFStream::CheckFile(FileFStream *this,string *hint)

{
  string local_80;
  string local_60;
  string local_40;
  
  if (((&this->field_0x110)[*(long *)(*(long *)&this->m_FileStream + -0x18)] & 5) != 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Toolkit","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"transport::file::FileFStream","");
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CheckFile","");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_40,&local_60,&local_80,hint,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void FileFStream::CheckFile(const std::string hint) const
{
    if (!m_FileStream)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileFStream",
                                              "CheckFile", hint);
    }
}